

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DecoratorNinePatch.cpp
# Opt level: O1

DecoratorDataHandle __thiscall
Rml::DecoratorNinePatch::GenerateElementData
          (DecoratorNinePatch *this,Element *element,BoxArea paint_area)

{
  Colourb CVar1;
  undefined4 uVar2;
  int iVar3;
  array<Rml::NumericValue,_4UL> *paVar4;
  Element *this_00;
  int y;
  ComputedValues *pCVar5;
  Vector2i VVar6;
  int *piVar7;
  RenderManager *this_01;
  RenderManager *mesh_00;
  int i;
  long lVar8;
  long lVar9;
  long lVar10;
  int x;
  long lVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  Vector2f surface_pos [4];
  Vector2f surface_dimensions;
  Vector2f tex_pos [4];
  Vector2f surface_center_size;
  Mesh mesh;
  Vector2f tex_coords [4];
  Texture texture;
  RenderBox render_box;
  undefined8 uStack_170;
  float local_168 [2];
  undefined8 uStack_160;
  undefined8 local_158;
  Vector2f VStack_150;
  float local_144;
  Vector2f local_140;
  float local_138;
  float local_120;
  float local_11c;
  Vector2Type local_118;
  Vector2Type local_110;
  Vector2Type local_108;
  Vector2Type local_100;
  Vector2Type local_f8;
  undefined8 uStack_f0;
  Vector2Type local_e8;
  undefined8 uStack_e0;
  Element *local_d8;
  undefined8 local_d0;
  vector<Rml::Vertex,_std::allocator<Rml::Vertex>_> local_c8;
  vector<int,_std::allocator<int>_> vStack_b0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  Texture local_70;
  RenderBox local_60;
  
  uStack_170 = 0x20e627;
  local_138 = (float)paint_area;
  pCVar5 = Element::GetComputedValues(element);
  lVar8 = 0;
  uStack_170 = 0x20e636;
  local_70 = Decorator::GetTexture(&this->super_Decorator,0);
  uStack_170 = 0x20e64a;
  VVar6 = Texture::GetDimensions(&local_70);
  local_144 = (float)VVar6.x;
  uStack_170 = 0x20e679;
  local_d8 = element;
  Element::GetRenderBox(&local_60,element,(BoxArea)local_138,0);
  this_00 = local_d8;
  local_140 = local_60.fill_size;
  CVar1 = (pCVar5->rare).image_color;
  fVar12 = (float)((uint)CVar1 >> 0x18) * (pCVar5->inherited).opacity;
  local_138 = local_60.border_widths._M_elems[3];
  fVar13 = fVar12 / 255.0;
  local_11c = local_60.border_widths._M_elems[0];
  local_f8 = (this->rect_outer).p0;
  uStack_f0 = 0;
  local_118 = local_f8;
  local_110 = (this->rect_inner).p0;
  local_e8 = (this->rect_inner).p1;
  uStack_e0 = 0;
  local_108 = local_e8;
  local_100 = (this->rect_outer).p1;
  local_88 = 0;
  uStack_80 = 0;
  local_98 = 0;
  uStack_90 = 0;
  do {
    (&local_98)[lVar8] =
         CONCAT44((&local_118)[lVar8].y / (float)VVar6.y,(&local_118)[lVar8].x / local_144);
    lVar8 = lVar8 + 1;
  } while (lVar8 != 4);
  uStack_170 = 0x20e7b3;
  fVar14 = ElementUtilities::GetDensityIndependentPixelRatio(local_d8);
  fVar14 = fVar14 * this->display_scale;
  local_168[0] = 0.0;
  local_168[1] = 0.0;
  uStack_160._4_4_ = (local_110.y - local_f8.y) * fVar14;
  uStack_160._0_4_ = (local_110.x - local_f8.x) * fVar14;
  local_158._0_4_ = local_140.x - (local_100.x - local_e8.x) * fVar14;
  local_158._4_4_ = local_140.y - (local_100.y - local_e8.y) * fVar14;
  VStack_150 = local_140;
  paVar4 = (this->edges)._M_t.
           super___uniq_ptr_impl<std::array<Rml::NumericValue,_4UL>,_std::default_delete<std::array<Rml::NumericValue,_4UL>_>_>
           ._M_t.
           super__Tuple_impl<0UL,_std::array<Rml::NumericValue,_4UL>_*,_std::default_delete<std::array<Rml::NumericValue,_4UL>_>_>
           .super__Head_base<0UL,_std::array<Rml::NumericValue,_4UL>_*,_false>._M_head_impl;
  if (paVar4 != (array<Rml::NumericValue,_4UL> *)0x0) {
    local_e8.x = local_140.y;
    uStack_170 = 0x20e878;
    fVar14 = Element::ResolveNumericValue(this_00,paVar4->_M_elems[0],uStack_160._4_4_ - 0.0);
    local_f8.x = fVar14;
    uStack_170 = 0x20e89a;
    local_144 = Element::ResolveNumericValue
                          (this_00,((this->edges)._M_t.
                                    super___uniq_ptr_impl<std::array<Rml::NumericValue,_4UL>,_std::default_delete<std::array<Rml::NumericValue,_4UL>_>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_std::array<Rml::NumericValue,_4UL>_*,_std::default_delete<std::array<Rml::NumericValue,_4UL>_>_>
                                    .
                                    super__Head_base<0UL,_std::array<Rml::NumericValue,_4UL>_*,_false>
                                   ._M_head_impl)->_M_elems[1],VStack_150.x - (float)local_158);
    uStack_170 = 0x20e8bc;
    local_120 = Element::ResolveNumericValue
                          (this_00,((this->edges)._M_t.
                                    super___uniq_ptr_impl<std::array<Rml::NumericValue,_4UL>,_std::default_delete<std::array<Rml::NumericValue,_4UL>_>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_std::array<Rml::NumericValue,_4UL>_*,_std::default_delete<std::array<Rml::NumericValue,_4UL>_>_>
                                    .
                                    super__Head_base<0UL,_std::array<Rml::NumericValue,_4UL>_*,_false>
                                   ._M_head_impl)->_M_elems[2],VStack_150.y - local_158._4_4_);
    uStack_170 = 0x20e8dd;
    uStack_160._0_4_ =
         Element::ResolveNumericValue
                   (this_00,((this->edges)._M_t.
                             super___uniq_ptr_impl<std::array<Rml::NumericValue,_4UL>,_std::default_delete<std::array<Rml::NumericValue,_4UL>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::array<Rml::NumericValue,_4UL>_*,_std::default_delete<std::array<Rml::NumericValue,_4UL>_>_>
                             .super__Head_base<0UL,_std::array<Rml::NumericValue,_4UL>_*,_false>.
                            _M_head_impl)->_M_elems[3],(float)uStack_160 - local_168[0]);
    local_158._0_4_ = local_140.x - local_144;
    local_158._4_4_ = local_e8.x - local_120;
    uStack_160._4_4_ = local_f8.x;
  }
  local_d0 = CONCAT44(local_158._4_4_ - uStack_160._4_4_,(float)local_158 - (float)uStack_160);
  lVar8 = 0;
  do {
    if (*(float *)((long)&local_d0 + lVar8) <= 0.0 && *(float *)((long)&local_d0 + lVar8) != 0.0) {
      fVar14 = *(float *)((long)&local_110.x + lVar8) - *(float *)((long)&local_118.x + lVar8);
      fVar14 = (fVar14 / ((*(float *)((long)&local_100.x + lVar8) -
                          *(float *)((long)&local_108.x + lVar8)) + fVar14)) *
               *(float *)((long)&local_140.x + lVar8);
      *(float *)((long)&uStack_160 + lVar8) = fVar14;
      *(float *)((long)&local_158 + lVar8) = fVar14;
    }
    lVar8 = lVar8 + 4;
  } while (lVar8 == 4);
  lVar8 = 4;
  do {
    *(float *)((long)&uStack_170 + lVar8 + 4) =
         *(float *)((long)&uStack_170 + lVar8 + 4) + local_138;
    *(float *)((long)local_168 + lVar8) = *(float *)((long)local_168 + lVar8) + local_11c;
    lVar8 = lVar8 + 8;
  } while (lVar8 != 0x24);
  uStack_170 = 0x20e9d1;
  local_138 = Math::Round((float)uStack_160);
  uStack_170 = 0x20e9e1;
  fVar14 = Math::Round(uStack_160._4_4_);
  uStack_160 = CONCAT44(fVar14,local_138);
  uStack_170 = 0x20e9f9;
  local_138 = Math::Round((float)local_158);
  uStack_170 = 0x20ea09;
  fVar14 = Math::Round(local_158._4_4_);
  local_158 = CONCAT44(fVar14,local_138);
  vStack_b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
       = (pointer)0x0;
  vStack_b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_c8.super__Vector_base<Rml::Vertex,_std::allocator<Rml::Vertex>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  vStack_b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_c8.super__Vector_base<Rml::Vertex,_std::allocator<Rml::Vertex>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_c8.super__Vector_base<Rml::Vertex,_std::allocator<Rml::Vertex>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  lVar9 = 0x10;
  uStack_170 = 0x20ea3b;
  ::std::vector<Rml::Vertex,_std::allocator<Rml::Vertex>_>::resize(&local_c8,0x10);
  lVar8 = 0;
  do {
    fVar14 = local_168[lVar8 * 2 + 1];
    uVar2 = *(undefined4 *)((long)&local_98 + lVar8 * 8 + 4);
    lVar11 = 0;
    lVar10 = lVar9;
    do {
      *(uint *)((long)local_c8.super__Vector_base<Rml::Vertex,_std::allocator<Rml::Vertex>_>._M_impl
                      .super__Vector_impl_data._M_start + lVar10 + -8) =
           (int)fVar12 << 0x18 |
           ((int)((float)((uint)CVar1 >> 0x10 & 0xff) * fVar13) & 0xffU) << 0x10 |
           ((int)((float)((uint)CVar1 >> 8 & 0xff) * fVar13) & 0xffU) << 8 |
           (int)((float)((uint)CVar1 & 0xff) * fVar13) & 0xffU;
      *(float *)((long)local_c8.super__Vector_base<Rml::Vertex,_std::allocator<Rml::Vertex>_>.
                       _M_impl.super__Vector_impl_data._M_start + lVar10 + -0x10) =
           local_168[lVar11 * 2];
      *(float *)((long)local_c8.super__Vector_base<Rml::Vertex,_std::allocator<Rml::Vertex>_>.
                       _M_impl.super__Vector_impl_data._M_start + lVar10 + -0xc) = fVar14;
      *(undefined4 *)
       ((long)local_c8.super__Vector_base<Rml::Vertex,_std::allocator<Rml::Vertex>_>._M_impl.
              super__Vector_impl_data._M_start + lVar10 + -4) = *(undefined4 *)(&local_98 + lVar11);
      *(undefined4 *)
       ((long)&((local_c8.super__Vector_base<Rml::Vertex,_std::allocator<Rml::Vertex>_>._M_impl.
                 super__Vector_impl_data._M_start)->position).x + lVar10) = uVar2;
      lVar11 = lVar11 + 1;
      lVar10 = lVar10 + 0x14;
    } while (lVar11 != 4);
    lVar8 = lVar8 + 1;
    lVar9 = lVar9 + 0x50;
  } while (lVar8 != 4);
  uStack_170 = 0x20eaa6;
  ::std::vector<int,_std::allocator<int>_>::resize(&vStack_b0,0x36);
  piVar7 = vStack_b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start + 5;
  lVar8 = 0;
  do {
    iVar3 = *(int *)((long)&DAT_002d75d0 + lVar8);
    piVar7[-5] = iVar3;
    piVar7[-4] = iVar3 + 4;
    piVar7[-3] = iVar3 + 1;
    piVar7[-2] = iVar3 + 1;
    piVar7[-1] = iVar3 + 4;
    *piVar7 = iVar3 + 5;
    piVar7 = piVar7 + 6;
    lVar8 = lVar8 + 4;
  } while (lVar8 != 0x24);
  uStack_170 = 0x20eaf3;
  this_01 = (RenderManager *)operator_new(0x10);
  uStack_170 = 0x20eafe;
  mesh_00 = Element::GetRenderManager(this_00);
  uStack_170 = 0x20eb11;
  RenderManager::MakeGeometry(this_01,(Mesh *)mesh_00);
  if (vStack_b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    uStack_170 = 0x20eb2e;
    operator_delete(vStack_b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)vStack_b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)vStack_b0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_c8.super__Vector_base<Rml::Vertex,_std::allocator<Rml::Vertex>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    uStack_170 = 0x20eb4b;
    operator_delete(local_c8.super__Vector_base<Rml::Vertex,_std::allocator<Rml::Vertex>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_c8.super__Vector_base<Rml::Vertex,_std::allocator<Rml::Vertex>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_c8.super__Vector_base<Rml::Vertex,_std::allocator<Rml::Vertex>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return (DecoratorDataHandle)this_01;
}

Assistant:

DecoratorDataHandle DecoratorNinePatch::GenerateElementData(Element* element, BoxArea paint_area) const
{
	const auto& computed = element->GetComputedValues();

	Texture texture = GetTexture();
	const Vector2f texture_dimensions(texture.GetDimensions());

	const RenderBox render_box = element->GetRenderBox(paint_area);
	const Vector2f surface_offset = render_box.GetFillOffset();
	const Vector2f surface_dimensions = render_box.GetFillSize();

	const ColourbPremultiplied quad_colour = computed.image_color().ToPremultiplied(computed.opacity());

	/* In the following, we operate on the four diagonal vertices in the grid, as they define the whole grid. */

	// Absolute texture coordinates 'px'
	Vector2f tex_pos[4] = {
		rect_outer.TopLeft(),
		rect_inner.TopLeft(),
		rect_inner.BottomRight(),
		rect_outer.BottomRight(),
	};

	// Normalized texture coordinates [0, 1]
	Vector2f tex_coords[4];
	for (int i = 0; i < 4; i++)
		tex_coords[i] = tex_pos[i] / texture_dimensions;

	// Natural size is determined from the raw pixel size multiplied by the dp-ratio and the sprite's
	// display scale (determined by eg. the inverse of spritesheet's 'src-scale').
	const float scale_raw_to_natural_dimensions = ElementUtilities::GetDensityIndependentPixelRatio(element) * display_scale;

	// Surface position in pixels [0, surface_dimensions]
	// Need to keep the corner patches at their natural size, but stretch the inner patches.
	Vector2f surface_pos[4];
	surface_pos[0] = {0, 0};
	surface_pos[1] = (tex_pos[1] - tex_pos[0]) * scale_raw_to_natural_dimensions;
	surface_pos[2] = surface_dimensions - (tex_pos[3] - tex_pos[2]) * scale_raw_to_natural_dimensions;
	surface_pos[3] = surface_dimensions;

	// Change the size of the edges if specified.
	if (edges)
	{
		float lengths[4]; // top, right, bottom, left
		lengths[0] = element->ResolveNumericValue((*edges)[0], (surface_pos[1].y - surface_pos[0].y));
		lengths[1] = element->ResolveNumericValue((*edges)[1], (surface_pos[3].x - surface_pos[2].x));
		lengths[2] = element->ResolveNumericValue((*edges)[2], (surface_pos[3].y - surface_pos[2].y));
		lengths[3] = element->ResolveNumericValue((*edges)[3], (surface_pos[1].x - surface_pos[0].x));

		surface_pos[1].y = lengths[0];
		surface_pos[2].x = surface_dimensions.x - lengths[1];
		surface_pos[2].y = surface_dimensions.y - lengths[2];
		surface_pos[1].x = lengths[3];
	}

	// In case the surface dimensions are less than the size of the corners, we need to scale down the corner rectangles, one dimension at a time.
	const Vector2f surface_center_size = surface_pos[2] - surface_pos[1];
	for (int i = 0; i < 2; i++)
	{
		if (surface_center_size[i] < 0.0f)
		{
			float top_left_size = tex_pos[1][i] - tex_pos[0][i];
			float bottom_right_size = tex_pos[3][i] - tex_pos[2][i];
			surface_pos[1][i] = top_left_size / (top_left_size + bottom_right_size) * surface_dimensions[i];
			surface_pos[2][i] = surface_pos[1][i];
		}
	}

	// Now offset all positions, relative to the border box.
	for (Vector2f& surface_pos_entry : surface_pos)
		surface_pos_entry += surface_offset;

	// Round the inner corners
	surface_pos[1] = surface_pos[1].Round();
	surface_pos[2] = surface_pos[2].Round();

	/* Now we have all the coordinates we need. Expand the diagonal vertices to the 16 individual vertices. */
	Mesh mesh;
	Vector<Vertex>& vertices = mesh.vertices;
	Vector<int>& indices = mesh.indices;

	vertices.resize(4 * 4);

	for (int y = 0; y < 4; y++)
	{
		for (int x = 0; x < 4; x++)
		{
			Vertex& vertex = vertices[y * 4 + x];
			vertex.colour = quad_colour;
			vertex.position = {surface_pos[x].x, surface_pos[y].y};
			vertex.tex_coord = {tex_coords[x].x, tex_coords[y].y};
		}
	}

	// Nine rectangles, two triangles per rectangle, three indices per triangle.
	indices.resize(9 * 2 * 3);

	// Fill in the indices one rectangle at a time.
	const int top_left_indices[9] = {0, 1, 2, 4, 5, 6, 8, 9, 10};
	for (int rectangle = 0; rectangle < 9; rectangle++)
	{
		int i = rectangle * 6;
		int top_left_index = top_left_indices[rectangle];
		indices[i] = top_left_index;
		indices[i + 1] = top_left_index + 4;
		indices[i + 2] = top_left_index + 1;
		indices[i + 3] = top_left_index + 1;
		indices[i + 4] = top_left_index + 4;
		indices[i + 5] = top_left_index + 5;
	}

	Geometry* data = new Geometry(element->GetRenderManager()->MakeGeometry(std::move(mesh)));

	return reinterpret_cast<DecoratorDataHandle>(data);
}